

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

Diagnostic * __thiscall
slang::ast::Scope::addDiag(Scope *this,DiagCode code,SourceLocation location)

{
  Diagnostic *pDVar1;
  Diagnostic *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  Symbol *in_stack_ffffffffffffff38;
  Diagnostic *this_00;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 local_88 [120];
  undefined4 in_stack_fffffffffffffff8;
  
  this_00 = (Diagnostic *)*in_RDI;
  Diagnostic::Diagnostic
            (this_00,in_stack_ffffffffffffff38,SUB84((ulong)in_stack_ffffffffffffff50 >> 0x20,0),
             (SourceLocation)local_88);
  pDVar1 = Compilation::addDiag((Compilation *)CONCAT44(in_ESI,in_stack_fffffffffffffff8),in_RDX);
  Diagnostic::~Diagnostic(this_00);
  return pDVar1;
}

Assistant:

Diagnostic& Scope::addDiag(DiagCode code, SourceLocation location) const {
    return compilation.addDiag(Diagnostic(*thisSym, code, location));
}